

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O3

void __thiscall
direct_solvers_lower_upper_factorisation_not_factorised_Test::
~direct_solvers_lower_upper_factorisation_not_factorised_Test
          (direct_solvers_lower_upper_factorisation_not_factorised_Test *this)

{
  pointer puVar1;
  
  (this->super_direct_solvers).super_Test._vptr_Test = (_func_int **)&PTR__direct_solvers_00156b80;
  puVar1 = (this->super_direct_solvers).lup_solver.pivots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_direct_solvers).lup_solver.pivots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&(this->super_direct_solvers).lup_solver.lu_factorised.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  puVar1 = (this->super_direct_solvers).lu_solver.pivots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_direct_solvers).lu_solver.pivots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&(this->super_direct_solvers).lu_solver.lu_factorised.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(direct_solvers, lower_upper_factorisation_not_factorised) {

  Vector_Dense<Scalar, 0> b_vector = {6, 2, 7};
  Vector_Dense<Scalar, 0> x_vector = {0, 0, 0};
  Matrix_Dense<Scalar, 0, 0> matrix = {{0, 0, 0}, {9, 5, 1}, {4, 3, 8}};  // singular.

  EXPECT_FALSE(lu_solver.factorise(matrix));
  EXPECT_FALSE(lup_solver.factorise(matrix));

  EXPECT_FALSE(lu_solver.solve_system(x_vector, b_vector).converged);
  EXPECT_FALSE(lup_solver.solve_system(x_vector, b_vector).converged);
}